

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O3

int CVodeGetQuadSensNumRhsEvals(void *cvode_mem,long *nfQSevals)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x7d2;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x108) != 0) {
      *nfQSevals = *(long *)((long)cvode_mem + 0x650);
      return 0;
    }
    msgfmt = "Forward sensitivity analysis for quadrature variables not activated.";
    iVar1 = -0x32;
    error_code = -0x32;
    line = 0x7da;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetQuadSensNumRhsEvals",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVodeGetQuadSensNumRhsEvals(void* cvode_mem, long int* nfQSevals)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_quadr_sensi == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUADSENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUADSENSI);
    return (CV_NO_QUADSENS);
  }

  *nfQSevals = cv_mem->cv_nfQSe;

  return (CV_SUCCESS);
}